

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QRectF * __thiscall
QGraphicsItemPrivate::effectiveBoundingRect
          (QRectF *__return_storage_ptr__,QGraphicsItemPrivate *this,
          QGraphicsItem *topMostEffectItem)

{
  QGraphicsItem *this_00;
  QGraphicsEffect *this_01;
  QGraphicsItemPrivate *pQVar1;
  bool bVar2;
  uint uVar3;
  QGraphicsItem *other;
  long in_FS_OFFSET;
  QRectF local_e8;
  QRectF local_c8;
  QRectF local_a8;
  QTransform local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->q_ptr;
  *(undefined4 *)&__return_storage_ptr__->w = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->w + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->h = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->h + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->xp = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->yp = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = 0xffffffff;
  (*this_00->_vptr_QGraphicsItem[3])((QRectF *)&local_88,this_00);
  effectiveBoundingRect(__return_storage_ptr__,this,(QRectF *)&local_88);
  if ((this_00 != topMostEffectItem) && ((*(ulong *)&this->field_0x160 & 0x120000) == 0)) {
    other = this->parent;
    do {
      if (other == (QGraphicsItem *)0x0) break;
      if ((this->scene != (QGraphicsScene *)0x0) &&
         (this_01 = ((other->d_ptr).d)->graphicsEffect, this_01 != (QGraphicsEffect *)0x0)) {
        bVar2 = QGraphicsEffect::isEnabled(this_01);
        if (bVar2) {
          local_a8.w._0_4_ = 0xffffffff;
          local_a8.w._4_4_ = 0xffffffff;
          local_a8.h._0_4_ = 0xffffffff;
          local_a8.h._4_4_ = 0xffffffff;
          local_a8.xp._0_4_ = 0xffffffff;
          local_a8.xp._4_4_ = 0xffffffff;
          local_a8.yp._0_4_ = 0xffffffff;
          local_a8.yp._4_4_ = 0xffffffff;
          QGraphicsItem::itemTransform(&local_88,this_00,other,(bool *)0x0);
          QTransform::mapRect(&local_a8);
          local_c8.w._0_4_ = 0xffffffff;
          local_c8.w._4_4_ = 0xffffffff;
          local_c8.h._0_4_ = 0xffffffff;
          local_c8.h._4_4_ = 0xffffffff;
          local_c8.xp._0_4_ = 0xffffffff;
          local_c8.xp._4_4_ = 0xffffffff;
          local_c8.yp._0_4_ = 0xffffffff;
          local_c8.yp._4_4_ = 0xffffffff;
          effectiveBoundingRect(&local_c8,(other->d_ptr).d,&local_a8);
          QGraphicsItem::itemTransform(&local_88,other,this_00,(bool *)0x0);
          QTransform::mapRect(&local_e8);
          __return_storage_ptr__->w = local_e8.w;
          __return_storage_ptr__->h = local_e8.h;
          __return_storage_ptr__->xp = local_e8.xp;
          __return_storage_ptr__->yp = local_e8.yp;
        }
      }
      pQVar1 = (other->d_ptr).d;
      uVar3 = (uint)*(undefined8 *)&pQVar1->field_0x160;
      if (((uVar3 >> 0x11 & 1) == 0) && (other != topMostEffectItem && (uVar3 >> 0x14 & 1) == 0)) {
        other = pQVar1->parent;
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
    } while (bVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsItemPrivate::effectiveBoundingRect(QGraphicsItem *topMostEffectItem) const
{
#if QT_CONFIG(graphicseffect)
    Q_Q(const QGraphicsItem);
    QRectF brect = effectiveBoundingRect(q_ptr->boundingRect());
    if (ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
        || ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren
        || topMostEffectItem == q)
        return brect;

    const QGraphicsItem *effectParent = parent;
    while (effectParent) {
        QGraphicsEffect *effect = effectParent->d_ptr->graphicsEffect;
        if (scene && effect && effect->isEnabled()) {
            const QRectF brectInParentSpace = q->mapRectToItem(effectParent, brect);
            const QRectF effectRectInParentSpace = effectParent->d_ptr->effectiveBoundingRect(brectInParentSpace);
            brect = effectParent->mapRectToItem(q, effectRectInParentSpace);
        }
        if (effectParent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
            || effectParent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren
            || topMostEffectItem == effectParent) {
            return brect;
        }
        effectParent = effectParent->d_ptr->parent;
    }

    return brect;
#else //QT_CONFIG(graphicseffect)
    Q_UNUSED(topMostEffectItem);
    return q_ptr->boundingRect();
#endif // QT_CONFIG(graphicseffect)

}